

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

void swrenderer::R_Subsector(subsector_t *sub)

{
  sector_t_conflict *sec;
  long lVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  int iVar5;
  int32_t iVar6;
  uint uVar7;
  secplane_t *psVar8;
  F3DFloor **ppFVar9;
  unsigned_short *puVar10;
  double dVar11;
  double dVar12;
  int local_36c;
  visplane_t *local_308;
  FDynamicColormap *local_300;
  visplane_t *local_2e0;
  FDynamicColormap *local_2d8;
  int local_2d0;
  bool local_2c9;
  uint local_2c8;
  ushort local_2c2;
  uint i_3;
  FTextureID FStack_2bc;
  WORD i_2;
  int shade;
  int local_2b4;
  double local_2b0;
  double fakeHeight_1;
  FTextureID local_2a0;
  uint i_1;
  double local_298;
  double fakeHeight;
  FTextureID local_288;
  int i;
  FTextureID local_280;
  FTextureID local_27c;
  FTextureID local_278;
  FTextureID local_274;
  lightlist_t *local_270;
  lightlist_t *light;
  visplane_t *backupcp;
  visplane_t *backupfp;
  FSectorPortal *portal;
  int position;
  int cll;
  int fll;
  int iStack_23c;
  bool outersubsector;
  int ceilinglightlevel;
  int floorlightlevel;
  sector_t_conflict tempsec;
  seg_t *line;
  int count;
  subsector_t *sub_local;
  
  sector_t::sector_t((sector_t *)&ceilinglightlevel);
  cll._3_1_ = InSubsector == (subsector_t *)0x0;
  if (((bool)cll._3_1_) &&
     (InSubsector = sub, (long)numsubsectors <= ((long)sub - (long)subsectors) / 0x30)) {
    I_Error("R_Subsector: ss %ti with numss = %i",((long)sub - (long)subsectors) / 0x30,
            (ulong)(uint)numsubsectors);
  }
  if (sub->sector == (sector_t_conflict *)0x0) {
    __assert_fail("sub->sector != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_bsp.cpp"
                  ,0x42d,"void swrenderer::R_Subsector(subsector_t *)");
  }
  if (sub->polys != (FPolyNode *)0x0) {
    R_AddPolyobjs(sub);
    if ((cll._3_1_ & 1) == 0) {
      return;
    }
    InSubsector = (subsector_t *)0x0;
    return;
  }
  frontsector = sub->sector;
  frontsector->MoreFlags = frontsector->MoreFlags | 0x80;
  tempsec.e = (extsector_t *)sub->firstline;
  frontsector = R_FakeFlat(frontsector,(sector_t_conflict *)&ceilinglightlevel,
                           &stack0xfffffffffffffdc4,&fll,false);
  position = iStack_23c;
  portal._4_4_ = fll;
  local_2c9 = true;
  if (::level.fadeto == 0) {
    uVar3 = PalEntry::operator_cast_to_unsigned_int(&frontsector->ColorMap->Fade);
    local_2c9 = true;
    if (uVar3 == 0) {
      local_2c9 = (::level.flags & 8) != 0;
    }
  }
  foggy = local_2c9;
  if (local_2c9 == false) {
    local_2d0 = extralight << 4;
  }
  else {
    local_2d0 = 0;
  }
  r_actualextralight = local_2d0;
  if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
     (uVar4 = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist),
     uVar4 != 0)) {
    local_270 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
    basecolormap = local_270->extra_colormap;
    if (local_270->p_lightlevel != &frontsector->lightlevel) {
      fll = (int)*local_270->p_lightlevel;
    }
  }
  else {
    bVar2 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
    if ((bVar2) && (-1 < fixedlightlev)) {
      local_2d8 = &FullNormalLight;
    }
    else {
      local_2d8 = frontsector->ColorMap;
    }
    basecolormap = local_2d8;
  }
  backupfp = (visplane_t *)sector_t::ValidatePortal((sector_t *)frontsector,1);
  iVar5 = secplane_t::PointOnSide(&frontsector->ceilingplane,&ViewPos);
  if (iVar5 < 1) {
    local_274 = sector_t::GetTexture((sector_t *)frontsector,1);
    bVar2 = FTextureID::operator==(&local_274,&skyflatnum);
    if ((bVar2) || (backupfp != (visplane_t *)0x0)) goto LAB_00355074;
    if ((frontsector->heightsec != (sector_t_conflict *)0x0) &&
       ((frontsector->heightsec->MoreFlags & 0x10) == 0)) {
      local_278 = sector_t::GetTexture((sector_t *)frontsector->heightsec,0);
      bVar2 = FTextureID::operator==(&local_278,&skyflatnum);
      if (bVar2) goto LAB_00355074;
    }
    local_2e0 = (visplane_t *)0x0;
  }
  else {
LAB_00355074:
    psVar8 = &frontsector->ceilingplane;
    local_27c = sector_t::GetTexture((sector_t *)frontsector,1);
    iVar5 = fll + r_actualextralight;
    dVar11 = sector_t::GetAlpha((sector_t *)frontsector,1);
    uVar4 = sector_t::GetFlags((sector_t *)frontsector,1);
    local_2e0 = R_FindPlane(psVar8,local_27c,iVar5,dVar11,(uVar4 & 4) != 0,
                            &frontsector->planes[1].xform,frontsector->sky,(FSectorPortal *)backupfp
                           );
  }
  ceilingplane = local_2e0;
  if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
     (uVar4 = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist),
     uVar4 != 0)) {
    local_270 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
    basecolormap = local_270->extra_colormap;
    if (local_270->p_lightlevel != &frontsector->lightlevel) {
      iStack_23c = (int)*local_270->p_lightlevel;
    }
  }
  else {
    bVar2 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
    if ((bVar2) && (-1 < fixedlightlev)) {
      local_300 = &FullNormalLight;
    }
    else {
      local_300 = frontsector->ColorMap;
    }
    basecolormap = local_300;
  }
  backupfp = (visplane_t *)sector_t::ValidatePortal((sector_t *)frontsector,0);
  iVar5 = secplane_t::PointOnSide(&frontsector->floorplane,&ViewPos);
  if (iVar5 < 1) {
    local_280 = sector_t::GetTexture((sector_t *)frontsector,0);
    bVar2 = FTextureID::operator==(&local_280,&skyflatnum);
    if ((!bVar2) && (backupfp == (visplane_t *)0x0)) {
      if ((frontsector->heightsec != (sector_t_conflict *)0x0) &&
         ((frontsector->heightsec->MoreFlags & 0x10) == 0)) {
        i = (int)sector_t::GetTexture((sector_t *)frontsector->heightsec,1);
        bVar2 = FTextureID::operator==((FTextureID *)&i,&skyflatnum);
        if (bVar2) goto LAB_0035533e;
      }
      local_308 = (visplane_t *)0x0;
      goto LAB_00355408;
    }
  }
LAB_0035533e:
  psVar8 = &frontsector->floorplane;
  local_288 = sector_t::GetTexture((sector_t *)frontsector,0);
  iVar5 = iStack_23c + r_actualextralight;
  dVar11 = sector_t::GetAlpha((sector_t *)frontsector,0);
  uVar4 = sector_t::GetFlags((sector_t *)frontsector,0);
  local_308 = R_FindPlane(psVar8,local_288,iVar5,dVar11,(uVar4 & 4) != 0,(FTransform *)frontsector,
                          frontsector->sky,(FSectorPortal *)backupfp);
LAB_00355408:
  floorplane = local_308;
  iVar5 = FIntCVar::operator_cast_to_int(&r_3dfloors);
  if (((iVar5 != 0) && (frontsector->e != (extsector_t *)0x0)) &&
     (uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor), uVar4 != 0)) {
    backupcp = floorplane;
    light = (lightlist_t *)ceilingplane;
    for (fakeHeight._4_4_ = 0; iVar5 = fakeHeight._4_4_,
        uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor),
        iVar5 < (int)uVar4; fakeHeight._4_4_ = fakeHeight._4_4_ + 1) {
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                           (long)fakeHeight._4_4_);
      fakeFloor = *ppFVar9;
      if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
         (bVar2 = secplane_t::isSlope((fakeFloor->bottom).plane), !bVar2)) {
        if (((fakeFloor->flags & 0x20) == 0) || ((fakeFloor->flags & 0xc) != 0)) {
          R_3D_AddHeight((fakeFloor->top).plane,(sector_t *)frontsector);
        }
        if ((((fakeFloor->flags & 8) != 0) && (fakeFloor->alpha != 0)) &&
           (((fakeFloor->flags & 0x40000000) == 0 || ((fakeFloor->flags & 0x400000) == 0)))) {
          iVar6 = ::Scale(fakeFloor->alpha,0x10000,0xff);
          fakeAlpha = MIN<int>(iVar6,0x10000);
          if (fakeFloor->validcount != validcount) {
            fakeFloor->validcount = validcount;
            R_3D_NewClip();
          }
          dVar11 = secplane_t::ZatPoint((fakeFloor->top).plane,&frontsector->centerspot);
          local_298 = dVar11;
          if ((dVar11 < ViewPos.Z) &&
             (dVar12 = secplane_t::ZatPoint(&frontsector->floorplane,&frontsector->centerspot),
             dVar12 < dVar11)) {
            fake3D = 1;
            sector_t::operator=((sector_t *)&ceilinglightlevel,(sector_t_conflict *)fakeFloor->model
                               );
            secplane_t::operator=((secplane_t *)&tempsec.planes[1].TexZ,(fakeFloor->top).plane);
            secplane_t::operator=((secplane_t *)&tempsec.floorplane.negiC,(fakeFloor->bottom).plane)
            ;
            if (((fakeFloor->flags & 0x40000000) == 0) && ((fakeFloor->flags & 0x400000) == 0)) {
              i_1 = (uint)sector_t::GetTexture((sector_t *)&ceilinglightlevel,1);
              sector_t::SetTexture((sector_t *)&ceilinglightlevel,0,(FTextureID)i_1,true);
              portal._0_4_ = 1;
            }
            else {
              portal._0_4_ = 0;
            }
            frontsector = (sector_t_conflict *)&ceilinglightlevel;
            if ((fixedlightlev < 0) &&
               (uVar4 = TArray<lightlist_t,_lightlist_t>::Size(&(sub->sector->e->XFloor).lightlist),
               uVar4 != 0)) {
              local_270 = P_GetPlaneLight(sub->sector,&((sector_t *)frontsector)->floorplane,false);
              basecolormap = local_270->extra_colormap;
              iStack_23c = (int)*local_270->p_lightlevel;
            }
            ceilingplane = (visplane_t *)0x0;
            psVar8 = &((sector_t *)frontsector)->floorplane;
            local_2a0 = sector_t::GetTexture((sector_t *)frontsector,0);
            iVar5 = iStack_23c + r_actualextralight;
            dVar11 = sector_t::GetAlpha((sector_t *)frontsector,0);
            floorplane = R_FindPlane(psVar8,local_2a0,iVar5,dVar11,
                                     (fakeFloor->flags & 0x10000000) != 0,
                                     &((sector_t *)frontsector)->planes[(int)portal].xform,
                                     ((sector_t *)frontsector)->sky,(FSectorPortal *)0x0);
            R_FakeDrawLoop(sub);
            fake3D = 0;
            frontsector = sub->sector;
          }
        }
      }
    }
    for (fakeHeight_1._4_4_ = 0; uVar4 = fakeHeight_1._4_4_,
        uVar7 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor), uVar4 < uVar7
        ; fakeHeight_1._4_4_ = fakeHeight_1._4_4_ + 1) {
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                           (ulong)fakeHeight_1._4_4_);
      fakeFloor = *ppFVar9;
      if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
         (bVar2 = secplane_t::isSlope((fakeFloor->top).plane), !bVar2)) {
        if (((fakeFloor->flags & 0x20) == 0) || ((fakeFloor->flags & 0xc) != 0)) {
          R_3D_AddHeight((fakeFloor->bottom).plane,(sector_t *)frontsector);
        }
        if ((((fakeFloor->flags & 8) != 0) && (fakeFloor->alpha != 0)) &&
           (((fakeFloor->flags & 0x40000000) != 0 || ((fakeFloor->flags & 0x400010) != 0x400010))))
        {
          iVar6 = ::Scale(fakeFloor->alpha,0x10000,0xff);
          fakeAlpha = MIN<int>(iVar6,0x10000);
          if (fakeFloor->validcount != validcount) {
            fakeFloor->validcount = validcount;
            R_3D_NewClip();
          }
          dVar11 = secplane_t::ZatPoint((fakeFloor->bottom).plane,&frontsector->centerspot);
          local_2b0 = dVar11;
          if ((ViewPos.Z < dVar11) &&
             (dVar12 = secplane_t::ZatPoint(&frontsector->ceilingplane,&frontsector->centerspot),
             dVar11 < dVar12)) {
            fake3D = 2;
            sector_t::operator=((sector_t *)&ceilinglightlevel,(sector_t_conflict *)fakeFloor->model
                               );
            secplane_t::operator=((secplane_t *)&tempsec.planes[1].TexZ,(fakeFloor->top).plane);
            secplane_t::operator=((secplane_t *)&tempsec.floorplane.negiC,(fakeFloor->bottom).plane)
            ;
            if ((((fakeFloor->flags & 0x40000000) == 0) && ((fakeFloor->flags & 0x400000) == 0)) ||
               (((fakeFloor->flags & 0x40000000) != 0 && ((fakeFloor->flags & 0x400000) != 0)))) {
              local_2b4 = (int)sector_t::GetTexture((sector_t *)&ceilinglightlevel,0);
              sector_t::SetTexture((sector_t *)&ceilinglightlevel,1,(FTextureID)local_2b4,true);
              portal._0_4_ = 0;
            }
            else {
              portal._0_4_ = 1;
            }
            frontsector = (sector_t_conflict *)&ceilinglightlevel;
            secplane_t::ChangeHeight((secplane_t *)&tempsec.floorplane.negiC,-1.52587890625e-05);
            if ((fixedlightlev < 0) &&
               (uVar4 = TArray<lightlist_t,_lightlist_t>::Size(&(sub->sector->e->XFloor).lightlist),
               uVar4 != 0)) {
              local_270 = P_GetPlaneLight(sub->sector,&((sector_t *)frontsector)->ceilingplane,false
                                         );
              basecolormap = local_270->extra_colormap;
              fll = (int)*local_270->p_lightlevel;
            }
            secplane_t::ChangeHeight((secplane_t *)&tempsec.floorplane.negiC,1.52587890625e-05);
            floorplane = (visplane_t *)0x0;
            psVar8 = &((sector_t *)frontsector)->ceilingplane;
            shade = (int)sector_t::GetTexture((sector_t *)frontsector,1);
            iVar5 = fll + r_actualextralight;
            dVar11 = sector_t::GetAlpha((sector_t *)frontsector,1);
            ceilingplane = R_FindPlane(psVar8,(FTextureID)shade,iVar5,dVar11,
                                       (fakeFloor->flags & 0x10000000) != 0,
                                       &((sector_t *)frontsector)->planes[(int)portal].xform,
                                       ((sector_t *)frontsector)->sky,(FSectorPortal *)0x0);
            R_FakeDrawLoop(sub);
            fake3D = 0;
            frontsector = sub->sector;
          }
        }
      }
    }
    fakeFloor = (F3DFloor *)0x0;
    floorplane = backupcp;
    ceilingplane = (visplane_t *)light;
  }
  basecolormap = frontsector->ColorMap;
  iStack_23c = position;
  fll = portal._4_4_;
  sec = sub->sector;
  FStack_2bc = sector_t::GetTexture((sector_t *)frontsector,1);
  bVar2 = FTextureID::operator==(&stack0xfffffffffffffd44,&skyflatnum);
  if (bVar2) {
    local_36c = fll;
  }
  else {
    local_36c = iStack_23c;
  }
  R_AddSprites(sec,local_36c,(uint)FakeSide);
  if ((uint)(((long)sub - (long)subsectors) / 0x30) < (uint)numsubsectors) {
    iVar5 = (iStack_23c + fll) / 2 + r_actualextralight;
    puVar10 = TArray<unsigned_short,_unsigned_short>::operator[]
                        (&ParticlesInSubsec,((long)sub - (long)subsectors) / 0x30 & 0xffffffff);
    for (local_2c2 = *puVar10; local_2c2 != 0xffff; local_2c2 = Particles[local_2c2].snext) {
      R_ProjectParticle(Particles + (int)(uint)local_2c2,
                        subsectors[((long)sub - (long)subsectors) / 0x30].sector,
                        (iVar5 + 0xc) * -0x4000 + 0x400000,(uint)FakeSide);
    }
  }
  tempsec.e = (extsector_t *)sub->firstline;
  line._4_4_ = sub->numlines;
  while (line._4_4_ != 0) {
    if ((((cll._3_1_ & 1) == 0) ||
        (((tempsec.e)->Midtex).Floor.AttachedSectors.Array == (sector_t_conflict **)0x0)) ||
       ((*(byte *)((long)((tempsec.e)->Midtex).Floor.AttachedSectors.Array + 0xb4) & 0x40) == 0)) {
      iVar5 = FIntCVar::operator_cast_to_int(&r_3dfloors);
      if (((iVar5 != 0) &&
          (lVar1._0_4_ = ((tempsec.e)->Midtex).Floor.AttachedLines.Most,
          lVar1._4_4_ = ((tempsec.e)->Midtex).Floor.AttachedLines.Count, lVar1 != 0)) &&
         ((frontsector->e != (extsector_t *)0x0 &&
          (uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                             ((TArray<F3DFloor_*,_F3DFloor_*> *)
                              (*(long *)(*(long *)&((tempsec.e)->Midtex).Floor.AttachedLines.Most +
                                        0x210) + 0x70)), uVar4 != 0)))) {
        backupcp = floorplane;
        light = (lightlist_t *)ceilingplane;
        floorplane = (visplane_t *)0x0;
        ceilingplane = (visplane_t *)0x0;
        for (local_2c8 = 0;
            uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)(*(long *)&((tempsec.e)->Midtex).Floor.AttachedLines.Most +
                                         0x210) + 0x70)), local_2c8 < uVar4;
            local_2c8 = local_2c8 + 1) {
          ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)(*(long *)&((tempsec.e)->Midtex).Floor.AttachedLines.Most +
                                         0x210) + 0x70),(ulong)local_2c8);
          fakeFloor = *ppFVar9;
          if ((((fakeFloor->flags & 1) != 0) && ((fakeFloor->flags & 8) != 0)) &&
             (fakeFloor->model != (sector_t *)0x0)) {
            fake3D = 4;
            sector_t::operator=((sector_t *)&ceilinglightlevel,(sector_t_conflict *)fakeFloor->model
                               );
            secplane_t::operator=((secplane_t *)&tempsec.planes[1].TexZ,(fakeFloor->top).plane);
            secplane_t::operator=((secplane_t *)&tempsec.floorplane.negiC,(fakeFloor->bottom).plane)
            ;
            backsector = &ceilinglightlevel;
            if (fakeFloor->validcount != validcount) {
              fakeFloor->validcount = validcount;
              R_3D_NewClip();
            }
            R_AddLine((seg_t *)tempsec.e);
          }
        }
        fakeFloor = (F3DFloor *)0x0;
        fake3D = 0;
        floorplane = backupcp;
        ceilingplane = (visplane_t *)light;
      }
      R_AddLine((seg_t *)tempsec.e);
    }
    tempsec.e = (extsector_t *)&((tempsec.e)->Midtex).Ceiling;
    line._4_4_ = line._4_4_ - 1;
  }
  if ((cll._3_1_ & 1) != 0) {
    InSubsector = (subsector_t *)0x0;
  }
  return;
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = (r_fullbrightignoresectorcolor && fixedlightlev >= 0) ? &FullNormalLight : frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = (r_fullbrightignoresectorcolor && fixedlightlev >= 0) ? &FullNormalLight : frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}